

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::Sampler_testSamplerTags_Test::~Sampler_testSamplerTags_Test
          (Sampler_testSamplerTags_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Sampler, testSamplerTags)
{
    ConstSampler constTrue(true);
    ConstSampler constFalse(false);
    ProbabilisticSampler prob(0.1);
    RateLimitingSampler rate(0.1);

    const struct {
        Sampler& _sampler;
        std::string _samplerType;
        Tag::ValueType _samplerParam;
    } tests[] = { { constTrue, "const", true },
                  { constFalse, "const", false },
                  { prob, "probabilistic", 0.1 },
                  { rate, "ratelimiting", 0.1 } };

    for (auto&& test : tests) {
        const auto tags =
            test._sampler.isSampled(TraceID(), kTestOperationName).tags();
        auto count = 0;
        for (auto&& tag : tags) {
            if (tag.key() == kSamplerTypeTagKey) {
                ASSERT_TRUE(tag.value().is<const char*>());
                ASSERT_EQ(test._samplerType, tag.value().get<const char*>());
                ++count;
            }
            else if (tag.key() == kSamplerParamTagKey) {
                ASSERT_EQ(test._samplerParam, tag.value());
                ++count;
            }
        }
        ASSERT_EQ(2, count);
    }
}